

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedColorMasks.cpp
# Opt level: O2

IterateResult __thiscall
glcts::DrawBuffersIndexedColorMasks::iterate(DrawBuffersIndexedColorMasks *this)

{
  RenderContext *pRVar1;
  TestLog *pTVar2;
  byte bVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  RGBA epsilon;
  undefined4 extraout_var;
  ConstPixelBufferAccess *pCVar8;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  int i_3;
  GLint dbs;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  qpTestResult testResult;
  IterateResult IVar12;
  DrawBuffersIndexedColorMasks *pDVar13;
  int i;
  int i_4;
  uint local_2f0;
  allocator<char> local_2e9;
  GLint maxDrawBuffers;
  uint local_2e4;
  GLboolean mask [4];
  allocator<char> local_2c9;
  ulong local_2c8;
  GLenum local_2c0;
  GLuint tex;
  vector<unsigned_char,_std::allocator<unsigned_char>_> rendered;
  uint local_298 [6];
  DrawBuffersIndexedColorMasks *local_280;
  long local_278;
  string local_270;
  string local_250;
  TextureLevel textureLevel;
  ConstPixelBufferAccess local_208;
  BlendMaskStateMachine state;
  undefined1 local_1b8 [8];
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  long lVar7;
  
  iVar6 = (*((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar6);
  uVar9 = iterate::WriteMasksFormats[iterate::formatId];
  prepareFramebuffer(this);
  maxDrawBuffers = 0;
  (**(code **)(lVar7 + 0x868))(0x8824,&maxDrawBuffers);
  if (maxDrawBuffers < 4) {
    tcu::TestContext::setTestResult
              ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.super_TestNode
               .m_testCtx,QP_TEST_RESULT_FAIL,"Minimum number of draw buffers too low");
    return STOP;
  }
  (**(code **)(lVar7 + 0x6f8))(1,&tex);
  (**(code **)(lVar7 + 0xb8))(0x8c1a,tex);
  pDVar13 = (DrawBuffersIndexedColorMasks *)0x8c1a;
  local_2c8 = (ulong)uVar9;
  (**(code **)(lVar7 + 0x1398))(0x8c1a,1,(ulong)uVar9,0x20,0x20,maxDrawBuffers);
  for (iVar6 = 0; dbs = maxDrawBuffers, iVar6 < maxDrawBuffers; iVar6 = iVar6 + 1) {
    pDVar13 = (DrawBuffersIndexedColorMasks *)0x8d40;
    (**(code **)(lVar7 + 0x6b8))(0x8d40,iVar6 + 0x8ce0,tex,0,iVar6);
  }
  local_2c0 = ReadableType(pDVar13,(GLenum)local_2c8);
  if (local_2c0 == 0x1401) {
    local_1b8._0_4_ = 0x3e19999a;
    local_1b8._4_4_ = 0x3e99999a;
    uStack_1b0 = 0x3ee66666;
    uStack_1ac = 0x3f19999a;
    for (iVar6 = 0; iVar6 < dbs; iVar6 = iVar6 + 1) {
      (**(code **)(lVar7 + 0x1a8))(0x1800,iVar6,local_1b8);
      dbs = maxDrawBuffers;
    }
  }
  else if (local_2c0 == 0x1404) {
    local_1b8._0_4_ = I;
    local_1b8._4_4_ = UNORM_INT8;
    uStack_1b0 = 4;
    uStack_1ac = 5;
    for (iVar6 = 0; iVar6 < dbs; iVar6 = iVar6 + 1) {
      (**(code **)(lVar7 + 0x1b0))(0x1800,iVar6,local_1b8);
      dbs = maxDrawBuffers;
    }
  }
  else if (local_2c0 == 0x1405) {
    local_1b8._0_4_ = I;
    local_1b8._4_4_ = UNORM_INT8;
    uStack_1b0 = 4;
    uStack_1ac = 5;
    for (iVar6 = 0; iVar6 < dbs; iVar6 = iVar6 + 1) {
      (**(code **)(lVar7 + 0x1b8))(0x1800,iVar6,local_1b8);
      dbs = maxDrawBuffers;
    }
  }
  DrawBuffersIndexedBase::BlendMaskStateMachine::BlendMaskStateMachine
            (&state,(this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context,
             ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.super_TestNode.
             m_testCtx)->m_log,dbs);
  mask[0] = '\0';
  mask[1] = '\0';
  mask[2] = '\0';
  mask[3] = '\0';
  for (uVar9 = 0; (int)uVar9 < maxDrawBuffers; uVar9 = uVar9 + 1) {
    mask[uVar9 & 3] = '\x01';
    DrawBuffersIndexedBase::BlendMaskStateMachine::SetColorMaski
              (&state,uVar9,mask[0],mask[1],mask[2],mask[3]);
    mask[uVar9 & 3] = '\0';
  }
  if (local_2c0 == 0x1401) {
    local_1b8._0_4_ = 0x3f59999a;
    local_1b8._4_4_ = 0x3f59999a;
    uStack_1b0 = 0x3f59999a;
    uStack_1ac = 0x3f59999a;
    for (iVar6 = 0; iVar6 < maxDrawBuffers; iVar6 = iVar6 + 1) {
      (**(code **)(lVar7 + 0x1a8))(0x1800,iVar6,local_1b8);
    }
  }
  else if (local_2c0 == 0x1404) {
    local_1b8._0_4_ = DS|L;
    local_1b8._4_4_ = UNSIGNED_INT_999_E5_REV;
    uStack_1b0 = 0x17;
    uStack_1ac = 0x17;
    for (iVar6 = 0; iVar6 < maxDrawBuffers; iVar6 = iVar6 + 1) {
      (**(code **)(lVar7 + 0x1b0))(0x1800,iVar6,local_1b8);
    }
  }
  else if (local_2c0 == 0x1405) {
    local_1b8._0_4_ = DS|L;
    local_1b8._4_4_ = UNSIGNED_INT_999_E5_REV;
    uStack_1b0 = 0x17;
    uStack_1ac = 0x17;
    for (iVar6 = 0; iVar6 < maxDrawBuffers; iVar6 = iVar6 + 1) {
      (**(code **)(lVar7 + 0x1b8))(0x1800,iVar6,local_1b8);
    }
  }
  pDVar13 = this;
  local_278 = lVar7;
  epsilon = GetEpsilon(this);
  local_2e4 = NumComponents(pDVar13,(GLenum)local_2c8);
  bVar3 = 1;
  local_280 = this;
  for (uVar9 = 0; lVar7 = local_278, (int)uVar9 < maxDrawBuffers; uVar9 = uVar9 + 1) {
    (**(code **)(local_278 + 0x1218))(uVar9 + 0x8ce0);
    if (local_2c0 == 0x1401) {
      local_298[0] = 0x26;
      local_298[1] = 0x4c;
      local_298[2] = 0x72;
      local_298[3] = 0x99;
      local_298[uVar9 & 3] = 0xd8;
      if (local_2e4 < 2) {
        local_2f0 = 0xff000000;
        uVar11 = 0;
        uVar10 = 0;
      }
      else {
        uVar11 = local_298[1];
        if (local_2e4 == 2) {
          local_2f0 = 0xff000000;
          uVar10 = 0;
        }
        else {
          local_2f0 = local_298[3] << 0x18;
          uVar10 = local_298[2];
          if (local_2e4 != 4) {
            local_2f0 = 0xff000000;
          }
        }
      }
      uVar4 = local_298[0];
      local_298[1] = uVar11;
      local_298[2] = uVar10;
      local_1b8[0] = 0x2d;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&rendered,0x1000,(value_type_conflict5 *)local_1b8,(allocator_type *)&textureLevel)
      ;
      local_1b8._0_4_ = RGBA;
      local_1b8._4_4_ = UNORM_INT8;
      tcu::TextureLevel::TextureLevel(&textureLevel,(TextureFormat *)local_1b8,0x20,0x20,1);
      pRVar1 = ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->m_renderCtx;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1b8,&textureLevel);
      glu::readPixels(pRVar1,0,0,(PixelBufferAccess *)local_1b8);
      this = local_280;
      bVar5 = VerifyImg(local_280,&textureLevel,
                        (RGBA)(uVar10 << 0x10 | uVar11 << 8 | local_2f0 | uVar4),epsilon);
      if (!bVar5) {
        local_1b8 = (undefined1  [8])
                    ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                     super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
        std::operator<<((ostream *)&uStack_1b0,"Write mask error in texture format ");
        std::ostream::_M_insert<unsigned_long>((ulong)&uStack_1b0);
        std::operator<<((ostream *)&uStack_1b0," occurred for buffer #");
        std::ostream::operator<<((ostringstream *)&uStack_1b0,uVar9);
        std::operator<<((ostream *)&uStack_1b0,"\n");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
        pTVar2 = ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                  super_TestNode.m_testCtx)->m_log;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"Result",&local_2e9)
        ;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_270,"Rendered result image",&local_2c9);
        pCVar8 = &local_208;
        tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar8,&textureLevel);
        tcu::LogImage::LogImage
                  ((LogImage *)local_1b8,&local_250,&local_270,pCVar8,QP_IMAGE_COMPRESSION_MODE_BEST
                  );
        tcu::LogImage::write((LogImage *)local_1b8,(int)pTVar2,__buf_00,(size_t)pCVar8);
        tcu::LogImage::~LogImage((LogImage *)local_1b8);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::~string((string *)&local_250);
        bVar3 = 0;
      }
      tcu::TextureLevel::~TextureLevel(&textureLevel);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&rendered.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    else {
      if (local_2c0 == 0x1404) {
        uVar11 = 0;
        rendered.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x300000002;
        rendered.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x500000004;
        *(undefined4 *)
         ((long)&rendered.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + (ulong)(uVar9 & 3) * 4) = 0x17;
        if (local_2e4 < 2) {
          local_2f0 = 0x1000000;
          iVar6 = 0;
        }
        else {
          iVar6 = rendered.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start._4_4_;
          if (local_2e4 == 2) {
            local_2f0 = 0x1000000;
            uVar11 = 0;
          }
          else {
            local_2f0 = rendered.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x18;
            if (local_2e4 != 4) {
              local_2f0 = 0x1000000;
            }
            uVar11 = (int)rendered.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish << 0x10;
          }
        }
        uVar10 = (uint)rendered.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        rendered.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(iVar6,(uint)rendered.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
        local_1b8._0_4_ = RGBA;
        local_1b8._4_4_ = SIGNED_INT32;
        tcu::TextureLevel::TextureLevel(&textureLevel,(TextureFormat *)local_1b8,0x20,0x20,1);
        pRVar1 = ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->m_renderCtx;
        tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1b8,&textureLevel);
        glu::readPixels(pRVar1,0,0,(PixelBufferAccess *)local_1b8);
        this = local_280;
        bVar5 = VerifyImg(local_280,&textureLevel,(RGBA)(uVar11 | iVar6 << 8 | local_2f0 | uVar10),
                          epsilon);
        if (!bVar5) {
          local_1b8 = (undefined1  [8])
                      ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
          std::operator<<((ostream *)&uStack_1b0,"Write mask error in texture format ");
          std::ostream::_M_insert<unsigned_long>((ulong)&uStack_1b0);
          std::operator<<((ostream *)&uStack_1b0," occurred for buffer #");
          std::ostream::operator<<((ostringstream *)&uStack_1b0,uVar9);
          std::operator<<((ostream *)&uStack_1b0,"\n");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
          pTVar2 = ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                    super_TestNode.m_testCtx)->m_log;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_250,"Result",(allocator<char> *)local_298);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_270,"Rendered result image",&local_2e9);
          pCVar8 = &local_208;
          tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar8,&textureLevel);
          tcu::LogImage::LogImage
                    ((LogImage *)local_1b8,&local_250,&local_270,pCVar8,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)local_1b8,(int)pTVar2,__buf,(size_t)pCVar8);
LAB_00ccf3b9:
          tcu::LogImage::~LogImage((LogImage *)local_1b8);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_250);
          bVar3 = 0;
        }
      }
      else {
        if (local_2c0 != 0x1405) goto LAB_00ccf3f0;
        uVar11 = 0;
        rendered.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x300000002;
        rendered.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x500000004;
        *(undefined4 *)
         ((long)&rendered.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + (ulong)(uVar9 & 3) * 4) = 0x17;
        if (local_2e4 < 2) {
          local_2f0 = 0x1000000;
          iVar6 = 0;
        }
        else {
          iVar6 = rendered.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start._4_4_;
          if (local_2e4 == 2) {
            local_2f0 = 0x1000000;
            uVar11 = 0;
          }
          else {
            local_2f0 = rendered.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x18;
            if (local_2e4 != 4) {
              local_2f0 = 0x1000000;
            }
            uVar11 = (int)rendered.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish << 0x10;
          }
        }
        uVar10 = (uint)rendered.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        rendered.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(iVar6,(uint)rendered.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
        local_1b8._0_4_ = RGBA;
        local_1b8._4_4_ = UNSIGNED_INT32;
        tcu::TextureLevel::TextureLevel(&textureLevel,(TextureFormat *)local_1b8,0x20,0x20,1);
        pRVar1 = ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->m_renderCtx;
        tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1b8,&textureLevel);
        glu::readPixels(pRVar1,0,0,(PixelBufferAccess *)local_1b8);
        this = local_280;
        bVar5 = VerifyImg(local_280,&textureLevel,(RGBA)(uVar11 | iVar6 << 8 | local_2f0 | uVar10),
                          epsilon);
        if (!bVar5) {
          local_1b8 = (undefined1  [8])
                      ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
          std::operator<<((ostream *)&uStack_1b0,"Write mask error in texture format ");
          std::ostream::_M_insert<unsigned_long>((ulong)&uStack_1b0);
          std::operator<<((ostream *)&uStack_1b0," occurred for buffer #");
          std::ostream::operator<<((ostringstream *)&uStack_1b0,uVar9);
          std::operator<<((ostream *)&uStack_1b0,"\n");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
          pTVar2 = ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                    super_TestNode.m_testCtx)->m_log;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_250,"Result",(allocator<char> *)local_298);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_270,"Rendered result image",&local_2e9);
          pCVar8 = &local_208;
          tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar8,&textureLevel);
          tcu::LogImage::LogImage
                    ((LogImage *)local_1b8,&local_250,&local_270,pCVar8,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)local_1b8,(int)pTVar2,__buf_01,(size_t)pCVar8);
          goto LAB_00ccf3b9;
        }
      }
      tcu::TextureLevel::~TextureLevel(&textureLevel);
    }
LAB_00ccf3f0:
  }
  (**(code **)(local_278 + 0x238))(1,1,1);
  (**(code **)(lVar7 + 0xb8))(0x8c1a,0);
  testResult = QP_TEST_RESULT_FAIL;
  (**(code **)(lVar7 + 0x480))(1,&tex);
  releaseFramebuffer(this);
  iVar6 = (**(code **)(lVar7 + 0x800))();
  description = "Some functions generated error";
  if (iVar6 == 0) {
    description = "Write mask error occurred";
  }
  if ((bool)(bVar3 & iVar6 == 0)) {
    iterate::formatId = iterate::formatId + 1;
    if (iterate::formatId < 0x19) {
      IVar12 = CONTINUE;
      goto LAB_00ccf48f;
    }
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  tcu::TestContext::setTestResult
            ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.super_TestNode.
             m_testCtx,testResult,description);
  iterate::formatId = 0;
  IVar12 = STOP;
LAB_00ccf48f:
  std::
  _Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
  ::~_Vector_base((_Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                   *)&state);
  return IVar12;
}

Assistant:

tcu::TestNode::IterateResult DrawBuffersIndexedColorMasks::iterate()
{
	static const glw::GLenum WriteMasksFormats[] = { GL_R8,		 GL_RG8,	 GL_RGB8,	 GL_RGB565,  GL_RGBA4,
													 GL_RGB5_A1, GL_RGBA8,   GL_R8I,	  GL_R8UI,	GL_R16I,
													 GL_R16UI,   GL_R32I,	GL_R32UI,	GL_RG8I,	GL_RG8UI,
													 GL_RG16I,   GL_RG16UI,  GL_RG32I,	GL_RG32UI,  GL_RGBA8I,
													 GL_RGBA8UI, GL_RGBA16I, GL_RGBA16UI, GL_RGBA32I, GL_RGBA32UI };
	static const int	kSize	= 32;
	static unsigned int formatId = 0;

	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	glw::GLenum			  format = WriteMasksFormats[formatId];

	prepareFramebuffer();

	// Check number of available draw buffers
	glw::GLint maxDrawBuffers = 0;
	gl.getIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	if (maxDrawBuffers < 4)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Minimum number of draw buffers too low");
		return STOP;
	}

	// Prepare render targets
	glw::GLuint tex;
	gl.genTextures(1, &tex);
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, tex);
	gl.texStorage3D(GL_TEXTURE_2D_ARRAY, 1, format, kSize, kSize, maxDrawBuffers);
	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		gl.framebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + i, tex, 0, i);
	}

	// Clear all buffers
	switch (ReadableType(format))
	{
	case GL_UNSIGNED_BYTE:
	{
		tcu::Vec4 c0(0.15f, 0.3f, 0.45f, 0.6f);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferfv(GL_COLOR, i, &c0[0]);
		}
		break;
	}
	case GL_UNSIGNED_INT:
	{
		tcu::UVec4 c0(2, 3, 4, 5);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferuiv(GL_COLOR, i, &c0[0]);
		}
		break;
	}
	case GL_INT:
	{
		tcu::IVec4 c0(2, 3, 4, 5);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferiv(GL_COLOR, i, &c0[0]);
		}
		break;
	}
	}

	// Set color masks for each buffer
	BlendMaskStateMachine state(m_context, m_testCtx.getLog(), maxDrawBuffers);

	glw::GLboolean mask[] = { GL_FALSE, GL_FALSE, GL_FALSE, GL_FALSE };
	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		mask[i % 4] = GL_TRUE;
		state.SetColorMaski(i, mask[0], mask[1], mask[2], mask[3]);
		mask[i % 4] = GL_FALSE;
	}

	// Clear all buffers
	switch (ReadableType(format))
	{
	case GL_UNSIGNED_BYTE:
	{
		tcu::Vec4 c1(0.85f, 0.85f, 0.85f, 0.85f);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferfv(GL_COLOR, i, &c1[0]);
		}
		break;
	}
	case GL_UNSIGNED_INT:
	{
		tcu::UVec4 c1(23, 23, 23, 23);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferuiv(GL_COLOR, i, &c1[0]);
		}
		break;
	}
	case GL_INT:
	{
		tcu::IVec4 c1(23, 23, 23, 23);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferiv(GL_COLOR, i, &c1[0]);
		}
		break;
	}
	}

	// Verify color
	int		  numComponents = NumComponents(format);
	tcu::RGBA epsilon		= GetEpsilon();
	bool	  success		= true;

	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		gl.readBuffer(GL_COLOR_ATTACHMENT0 + i);

		switch (ReadableType(format))
		{
		case GL_UNSIGNED_BYTE:
		{
			tcu::UVec4 e(static_cast<unsigned int>(0.15f * 255), static_cast<unsigned int>(0.30f * 255),
						 static_cast<unsigned int>(0.45f * 255), static_cast<unsigned int>(0.60f * 255));
			e[i % 4] = static_cast<unsigned int>(0.85f * 255);
			e		 = tcu::UVec4(e.x(), numComponents >= 2 ? e.y() : 0, numComponents >= 3 ? e.z() : 0,
						   numComponents == 4 ? e.w() : 255);
			tcu::RGBA expected(e.x(), e.y(), e.z(), e.w());

			std::vector<unsigned char> rendered(kSize * kSize * 4, 45);

			tcu::TextureLevel textureLevel(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8),
										   kSize, kSize);
			glu::readPixels(m_context.getRenderContext(), 0, 0, textureLevel.getAccess());

			if (!VerifyImg(textureLevel, expected, epsilon))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Write mask error in texture format " << format
								   << " occurred for buffer #" << i << "\n"
								   << tcu::TestLog::EndMessage;
				m_testCtx.getLog() << tcu::TestLog::Image("Result", "Rendered result image", textureLevel.getAccess());
				success = false;
			}
			break;
		}
		case GL_UNSIGNED_INT:
		{
			tcu::UVec4 e(2, 3, 4, 5);
			e[i % 4] = 23;
			e		 = tcu::UVec4(e.x(), numComponents >= 2 ? e.y() : 0, numComponents >= 3 ? e.z() : 0,
						   numComponents == 4 ? e.w() : 1);
			tcu::RGBA expected(e.x(), e.y(), e.z(), e.w());

			tcu::TextureLevel textureLevel(
				tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT32), kSize, kSize);
			glu::readPixels(m_context.getRenderContext(), 0, 0, textureLevel.getAccess());

			if (!VerifyImg(textureLevel, expected, epsilon))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Write mask error in texture format " << format
								   << " occurred for buffer #" << i << "\n"
								   << tcu::TestLog::EndMessage;
				m_testCtx.getLog() << tcu::TestLog::Image("Result", "Rendered result image", textureLevel.getAccess());
				success = false;
			}
			break;
		}
		case GL_INT:
		{
			tcu::UVec4 e(2, 3, 4, 5);
			e[i % 4] = 23;
			e		 = tcu::UVec4(e.x(), numComponents >= 2 ? e.y() : 0, numComponents >= 3 ? e.z() : 0,
						   numComponents == 4 ? e.w() : 1);
			tcu::RGBA expected(e.x(), e.y(), e.z(), e.w());

			tcu::TextureLevel textureLevel(
				tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::SIGNED_INT32), kSize, kSize);
			glu::readPixels(m_context.getRenderContext(), 0, 0, textureLevel.getAccess());

			if (!VerifyImg(textureLevel, expected, epsilon))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Write mask error in texture format " << format
								   << " occurred for buffer #" << i << "\n"
								   << tcu::TestLog::EndMessage;
				m_testCtx.getLog() << tcu::TestLog::Image("Result", "Rendered result image", textureLevel.getAccess());
				success = false;
			}
			break;
		}
		}
	}

	gl.colorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, 0);
	gl.deleteTextures(1, &tex);
	releaseFramebuffer();

	// Check for error
	glw::GLenum error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Some functions generated error");
		formatId = 0;
		return STOP;
	}

	if (!success)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Write mask error occurred");
		formatId = 0;
		return STOP;
	}
	else
	{
		++formatId;
		if (formatId < (sizeof(WriteMasksFormats) / sizeof(WriteMasksFormats[0])))
		{
			return CONTINUE;
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
			formatId = 0;
			return STOP;
		}
	}
}